

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::ObjectivePropagation::updateActivityLbChange
          (ObjectivePropagation *this,HighsInt col,double oldbound,double newbound)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  LinkType LVar4;
  double *pdVar5;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  Reason RVar9;
  char *__to;
  int in_ESI;
  ObjectivePropagation *in_RDI;
  double in_XMM0_Qa;
  double dVar10;
  double dVar11;
  double in_XMM1_Qa;
  HighsInt newWorst;
  bool wasFirst;
  ObjectiveContributionTree contributionTree_1;
  HighsInt partition_1;
  double delta;
  HighsInt bestPos;
  double oldContribution;
  HighsInt currFirst;
  ObjectiveContributionTree contributionTree;
  HighsInt partition;
  HighsInt partitionPos;
  double in_stack_fffffffffffffeb8;
  HighsInt HVar12;
  HighsCDouble *other;
  HighsDomain *in_stack_fffffffffffffec0;
  ObjectivePropagation *in_stack_fffffffffffffec8;
  ObjectiveContributionTree *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffedc;
  HighsVarType var_type;
  double in_stack_fffffffffffffee0;
  double in_stack_fffffffffffffee8;
  value_type lower_bound;
  double in_stack_fffffffffffffef0;
  value_type upper_bound;
  CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> local_b0;
  HighsInt local_94;
  double local_90;
  double local_88;
  double local_80;
  uint local_74;
  double local_70;
  int local_64;
  CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> local_60;
  HighsInt local_44;
  Reason local_40;
  double local_38;
  uint local_2c;
  double in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  
  var_type = (HighsVarType)((uint)in_stack_fffffffffffffedc >> 0x18);
  if (in_RDI->cost[in_ESI] <= 0.0) {
    if (((in_RDI->cost[in_ESI] != 0.0) || (NAN(in_RDI->cost[in_ESI]))) && (in_XMM1_Qa < in_XMM0_Qa))
    {
      std::vector<double,_std::allocator<double>_>::operator[]
                (&in_RDI->domain->col_upper_,(long)in_ESI);
      HVar12 = (HighsInt)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
      HighsDomain::feastol((HighsDomain *)0x5bf8ac);
      variableType(in_stack_fffffffffffffec0,HVar12);
      boundRange(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                 var_type);
      pdVar5 = std::max<double>(&in_RDI->capacityThreshold,(double *)&stack0xffffffffffffffd8);
      in_RDI->capacityThreshold = *pdVar5;
      in_RDI->isPropagated = false;
    }
    debugCheckObjectiveLower(in_RDI);
    return;
  }
  in_RDI->isPropagated = false;
  local_2c = HighsObjectiveFunction::getColCliquePartition
                       ((HighsObjectiveFunction *)in_stack_fffffffffffffec0,
                        (HighsInt)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  if (local_2c == 0xffffffff) {
    if ((in_XMM0_Qa != -INFINITY) || (NAN(in_XMM0_Qa))) {
      HighsCDouble::operator-=((HighsCDouble *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
    else {
      in_RDI->numInfObjLower = in_RDI->numInfObjLower + -1;
    }
    if ((in_XMM1_Qa != -INFINITY) || (NAN(in_XMM1_Qa))) {
      HighsCDouble::operator+=
                ((HighsCDouble *)in_stack_fffffffffffffed0,(double)in_stack_fffffffffffffec8);
    }
    else {
      in_RDI->numInfObjLower = in_RDI->numInfObjLower + 1;
    }
    debugCheckObjectiveLower(in_RDI);
    if (in_XMM1_Qa < in_XMM0_Qa) {
      dVar10 = in_RDI->cost[in_ESI];
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->domain->col_upper_,(long)in_ESI);
      HVar12 = (HighsInt)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
      lower_bound = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->domain->col_lower_,(long)in_ESI);
      upper_bound = *pvVar6;
      HighsDomain::feastol((HighsDomain *)0x5bfac8);
      variableType(in_stack_fffffffffffffec0,HVar12);
      local_38 = boundRange(upper_bound,lower_bound,in_stack_fffffffffffffee0,var_type);
      local_38 = dVar10 * local_38;
      pdVar5 = std::max<double>(&in_RDI->capacityThreshold,&local_38);
      in_RDI->capacityThreshold = *pdVar5;
      return;
    }
    if (in_RDI->numInfObjLower != 0) {
      return;
    }
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x5bfb7c)
    ;
    HVar12 = (HighsInt)((ulong)in_XMM0_Qa >> 0x20);
    bVar1 = HighsCDouble::operator>
                      ((HighsCDouble *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (!bVar1) {
      return;
    }
    in_RDI->domain->infeasible_ = true;
    sVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                      (&in_RDI->domain->domchgstack_);
    in_RDI->domain->infeasible_pos = (HighsInt)sVar7;
    local_40 = Reason::objective();
    in_RDI->domain->infeasible_reason = local_40;
    updateActivityLbChange
              ((ObjectivePropagation *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),HVar12,in_XMM1_Qa,
               in_stack_ffffffffffffffd8);
    return;
  }
  if ((in_XMM1_Qa != 0.0) || (NAN(in_XMM1_Qa))) {
    pvVar8 = std::
             vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
             ::operator[](&in_RDI->objectiveLowerContributions,(long)(int)local_2c);
    HVar12 = (HighsInt)((ulong)in_XMM0_Qa >> 0x20);
    local_94 = pvVar8->partition;
    ObjectiveContributionTree::ObjectiveContributionTree
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (HighsInt)((ulong)in_stack_fffffffffffffec0 >> 0x20));
    uVar3 = ::highs::CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::
            first(&local_b0);
    bVar1 = uVar3 == local_2c;
    if (bVar1) {
      std::
      vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
      ::operator[](&in_RDI->objectiveLowerContributions,(long)(int)local_2c);
      HighsCDouble::operator+=
                ((HighsCDouble *)in_stack_fffffffffffffed0,(double)in_stack_fffffffffffffec8);
    }
    ::highs::CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::unlink
              (&local_b0,(char *)(ulong)local_2c);
    if ((bVar1) &&
       (LVar4 = ::highs::
                CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::first
                          (&local_b0), LVar4 != -1)) {
      std::
      vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
      ::operator[](&in_RDI->objectiveLowerContributions,(long)LVar4);
      HighsCDouble::operator-=((HighsCDouble *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
    debugCheckObjectiveLower(in_RDI);
    if (in_RDI->numInfObjLower != 0) {
      return;
    }
    other = &in_RDI->objectiveLower;
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x5c0055)
    ;
    bVar1 = HighsCDouble::operator>((HighsCDouble *)in_stack_fffffffffffffec0,(double)other);
    if (!bVar1) {
      return;
    }
    in_RDI->domain->infeasible_ = true;
    sVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                      (&in_RDI->domain->domchgstack_);
    in_RDI->domain->infeasible_pos = (HighsInt)sVar7;
    RVar9 = Reason::objective();
    in_RDI->domain->infeasible_reason = RVar9;
    updateActivityLbChange
              ((ObjectivePropagation *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),HVar12,in_XMM1_Qa,
               in_stack_ffffffffffffffd8);
    return;
  }
  pvVar8 = std::
           vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
           ::operator[](&in_RDI->objectiveLowerContributions,(long)(int)local_2c);
  local_44 = pvVar8->partition;
  ObjectiveContributionTree::ObjectiveContributionTree
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (HighsInt)((ulong)in_stack_fffffffffffffec0 >> 0x20));
  local_64 = ::highs::CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::
             first(&local_60);
  ::highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::link
            (&local_60.super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>,
             (char *)(ulong)local_2c,__to);
  local_70 = 0.0;
  if (local_64 != -1) {
    pvVar8 = std::
             vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
             ::operator[](&in_RDI->objectiveLowerContributions,(long)local_64);
    local_70 = pvVar8->contribution;
  }
  uVar3 = local_2c;
  uVar2 = ::highs::CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::
          first(&local_60);
  if (uVar3 == uVar2) {
    pvVar8 = std::
             vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
             ::operator[](&in_RDI->objectiveLowerContributions,(long)(int)local_2c);
    if ((pvVar8->contribution != local_70) || (NAN(pvVar8->contribution) || NAN(local_70))) {
      HighsCDouble::operator+=
                ((HighsCDouble *)in_stack_fffffffffffffed0,(double)in_stack_fffffffffffffec8);
      std::
      vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
      ::operator[](&in_RDI->objectiveLowerContributions,(long)(int)local_2c);
      HighsCDouble::operator-=((HighsCDouble *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      local_74 = ::highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::last
                           ((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                            0x5bfd7b);
      pvVar8 = std::
               vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
               ::operator[](&in_RDI->objectiveLowerContributions,(long)(int)local_2c);
      local_80 = pvVar8->contribution;
      if (local_74 != local_2c) {
        pvVar8 = std::
                 vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                 ::operator[](&in_RDI->objectiveLowerContributions,(long)(int)local_74);
        local_80 = local_80 - pvVar8->contribution;
      }
      dVar10 = local_80;
      dVar11 = HighsDomain::feastol((HighsDomain *)0x5bfe0a);
      local_88 = dVar10 * (1.0 - dVar11);
      pdVar5 = std::max<double>(&local_88,&in_RDI->capacityThreshold);
      in_RDI->capacityThreshold = *pdVar5;
      goto LAB_005bfef8;
    }
  }
  dVar10 = local_70;
  pvVar8 = std::
           vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
           ::operator[](&in_RDI->objectiveLowerContributions,(long)(int)local_2c);
  dVar10 = dVar10 - pvVar8->contribution;
  dVar11 = HighsDomain::feastol((HighsDomain *)0x5bfea9);
  local_90 = dVar10 * (1.0 - dVar11);
  pdVar5 = std::max<double>(&local_90,&in_RDI->capacityThreshold);
  in_RDI->capacityThreshold = *pdVar5;
LAB_005bfef8:
  debugCheckObjectiveLower(in_RDI);
  return;
}

Assistant:

void HighsDomain::ObjectivePropagation::updateActivityLbChange(
    HighsInt col, double oldbound, double newbound) {
  if (cost[col] <= 0.0) {
    if (cost[col] != 0.0 && newbound < oldbound) {
      capacityThreshold =
          std::max(capacityThreshold,
                   -cost[col] * boundRange(domain->col_upper_[col], newbound,
                                           domain->feastol(),
                                           domain->variableType(col)));
      isPropagated = false;
    }
    debugCheckObjectiveLower();
    return;
  }

  isPropagated = false;

  HighsInt partitionPos = objFunc->getColCliquePartition(col);
  if (partitionPos == -1) {
    if (oldbound == -kHighsInf)
      --numInfObjLower;
    else
      objectiveLower -= oldbound * cost[col];

    if (newbound == -kHighsInf)
      ++numInfObjLower;
    else
      objectiveLower += newbound * cost[col];

    debugCheckObjectiveLower();

    if (newbound < oldbound) {
      capacityThreshold = std::max(
          capacityThreshold,
          cost[col] * boundRange(domain->col_upper_[col],
                                 domain->col_lower_[col], domain->feastol(),
                                 domain->variableType(col)));
    } else if (numInfObjLower == 0 &&
               objectiveLower > domain->mipsolver->mipdata_->upper_limit) {
      domain->infeasible_ = true;
      domain->infeasible_pos = domain->domchgstack_.size();
      domain->infeasible_reason = Reason::objective();
      updateActivityLbChange(col, newbound, oldbound);
    }
  } else {
    if (newbound == 0.0) {
      assert(oldbound == 1.0);
      // binary lower bound of variable in clique partition is relaxed to 0
      HighsInt partition = objectiveLowerContributions[partitionPos].partition;
      ObjectiveContributionTree contributionTree(this, partition);
      HighsInt currFirst = contributionTree.first();

      contributionTree.link(partitionPos);

      double oldContribution = 0.0;
      if (currFirst != -1)
        oldContribution = objectiveLowerContributions[currFirst].contribution;

      if (partitionPos == contributionTree.first() &&
          objectiveLowerContributions[partitionPos].contribution !=
              oldContribution) {
        objectiveLower += oldContribution;
        objectiveLower -=
            objectiveLowerContributions[partitionPos].contribution;

        // update the capacity threshold with the difference of the new highest
        // contribution position to the lowest contribution as the column with
        // the lowest contribution can be fixed to its bound that yields the
        // highest objective value.
        HighsInt bestPos = contributionTree.last();
        double delta = objectiveLowerContributions[partitionPos].contribution;
        if (bestPos != partitionPos)
          delta -= objectiveLowerContributions[bestPos].contribution;
        capacityThreshold =
            std::max(delta * (1.0 - domain->feastol()), capacityThreshold);
      } else {
        // the new linked column could be the one with the new lowest
        // contribution so update the capacity threshold to ensure propagation
        // runs when it can be fixed to the bound that yields the highest
        // objective value
        capacityThreshold =
            std::max((oldContribution -
                      objectiveLowerContributions[partitionPos].contribution) *
                         (1.0 - domain->feastol()),
                     capacityThreshold);
      }

      debugCheckObjectiveLower();
    } else {
      // binary lower bound of variable in clique partition is tightened to 1
      assert(oldbound == 0.0);
      assert(newbound == 1.0);

      HighsInt partition = objectiveLowerContributions[partitionPos].partition;
      ObjectiveContributionTree contributionTree(this, partition);
      bool wasFirst = contributionTree.first() == partitionPos;
      if (wasFirst)
        objectiveLower +=
            objectiveLowerContributions[partitionPos].contribution;

      contributionTree.unlink(partitionPos);

      if (wasFirst) {
        HighsInt newWorst = contributionTree.first();
        if (newWorst != -1)
          objectiveLower -= objectiveLowerContributions[newWorst].contribution;
      }

      debugCheckObjectiveLower();

      if (numInfObjLower == 0 &&
          objectiveLower > domain->mipsolver->mipdata_->upper_limit) {
        domain->infeasible_ = true;
        domain->infeasible_pos = domain->domchgstack_.size();
        domain->infeasible_reason = Reason::objective();
        updateActivityLbChange(col, newbound, oldbound);
      }
    }
  }
}